

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O0

void raptor::LogFormatPrint(char *file,int line,LogLevel level,char *format,...)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  char *local_60;
  LogArgument tmp;
  va_list args;
  char *local_28;
  char *message;
  char *format_local;
  LogLevel level_local;
  int line_local;
  char *file_local;
  
  local_28 = (char *)0x0;
  tmp.message._4_4_ = 0x30;
  tmp.message._0_4_ = 0x20;
  message = format;
  format_local._0_4_ = level;
  format_local._4_4_ = line;
  _level_local = file;
  iVar1 = vasprintf(&local_28,format,&tmp.message);
  if (iVar1 != -1) {
    lVar2 = Atomic<long>::Load((Atomic<long> *)&(anonymous_namespace)::g_min_level,RELAXED);
    if (lVar2 <= (int)(LogLevel)format_local) {
      local_60 = _level_local;
      tmp.file._0_4_ = format_local._4_4_;
      tmp.file._4_4_ = (LogLevel)format_local;
      tmp._8_8_ = local_28;
      pcVar3 = (code *)Atomic<long>::Load((Atomic<long> *)&(anonymous_namespace)::g_log_function,
                                          RELAXED);
      (*pcVar3)(&local_60);
    }
    Free(local_28);
  }
  return;
}

Assistant:

void LogFormatPrint(
                    const char* file,
                    int line,
                    LogLevel level,
                    const char* format, ...) {

    char* message = NULL;
    va_list args;
    va_start(args, format);

#ifdef _WIN32
    int ret = _vscprintf(format, args);
    va_end(args);
    if (ret < 0) {
        return;
    }

    size_t buff_len = (size_t)ret + 1;
    message = (char*)Malloc(buff_len);
    va_start(args, format);
    ret = vsnprintf_s(message, buff_len, _TRUNCATE, format, args);
    va_end(args);
#else
    if (vasprintf(&message, format, args) == -1) {  // stdio.h
        va_end(args);
        return;
    }
#endif

    if (g_min_level.Load() <= static_cast<intptr_t>(level)) {
        LogArgument tmp;
        tmp.file = file;
        tmp.line = line;
        tmp.level = level;
        tmp.message = message;
        ((LogTransferFunction)g_log_function.Load())(&tmp);
    }
    Free(message);
}